

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChProfiler.cpp
# Opt level: O2

void __thiscall chrono::utils::ChProfileIterator::Enter_Child(ChProfileIterator *this,int index)

{
  ChProfileNode *pCVar1;
  ChProfileNode **ppCVar2;
  bool bVar3;
  
  ppCVar2 = &this->CurrentParent->Child;
  while( true ) {
    pCVar1 = *ppCVar2;
    bVar3 = index == 0;
    index = index + -1;
    this->CurrentChild = pCVar1;
    if ((pCVar1 == (ChProfileNode *)0x0) || (bVar3)) break;
    ppCVar2 = &pCVar1->Sibling;
  }
  if (pCVar1 != (ChProfileNode *)0x0) {
    this->CurrentParent = pCVar1;
    this->CurrentChild = pCVar1->Child;
  }
  return;
}

Assistant:

void	ChProfileIterator::Enter_Child( int index )
{
	CurrentChild = CurrentParent->Get_Child();
	while ( (CurrentChild != NULL) && (index != 0) ) {
		index--;
		CurrentChild = CurrentChild->Get_Sibling();
	}

	if ( CurrentChild != NULL ) {
		CurrentParent = CurrentChild;
		CurrentChild = CurrentParent->Get_Child();
	}
}